

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O0

void __thiscall Num::delereZeros(Num *this,Num *number)

{
  bool bVar1;
  Short SVar2;
  Byte BVar3;
  ushort local_1a;
  Short k;
  Num *number_local;
  Num *this_local;
  
  for (local_1a = getSize(number);
      ((BVar3 = getDigit(number,local_1a - 1), BVar3 == 0 &&
       ((local_1a != 1 || (bVar1 = std::operator==(&number->base,"0"), !bVar1)))) &&
      ((bVar1 = std::operator==(&number->base,""), !bVar1 || (local_1a != 0))));
      local_1a = local_1a - 1) {
    std::__cxx11::string::erase((ulong)&number->base,(long)(int)(local_1a - 1));
  }
  SVar2 = std::__cxx11::string::size();
  number->size = SVar2;
  return;
}

Assistant:

void Num::delereZeros(Num& number) // delete insignificant zeros
{
    Num::Short k = number.getSize();
    while (number.getDigit(k - 1) == 0)
    {
        if ((k == 1 && number.base == "0") || (number.base == "" && k == 0))
            break;
        number.base.erase(k - 1);
        --k;
    }
    number.size = number.base.size();
}